

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

parser_error parse_prefs_color(parser *p)

{
  uint uVar1;
  wchar_t wVar2;
  char *pcVar3;
  parser_error pVar4;
  
  pcVar3 = (char *)parser_priv(p);
  if (pcVar3 == (char *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x406,"enum parser_error parse_prefs_color(struct parser *)");
  }
  pVar4 = PARSE_ERROR_NONE;
  if (*pcVar3 == '\0') {
    uVar1 = parser_getuint(p,"idx");
    if ((int)uVar1 < 0x20) {
      wVar2 = parser_getint(p,"k");
      angband_color_table[(int)uVar1][0] = (uint8_t)wVar2;
      wVar2 = parser_getint(p,"r");
      angband_color_table[(int)uVar1][1] = (uint8_t)wVar2;
      wVar2 = parser_getint(p,"g");
      angband_color_table[(int)uVar1][2] = (uint8_t)wVar2;
      wVar2 = parser_getint(p,"b");
      angband_color_table[(int)uVar1][3] = (uint8_t)wVar2;
    }
    else {
      pVar4 = PARSE_ERROR_OUT_OF_BOUNDS;
      if (uVar1 < 0x100) {
        pVar4 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_prefs_color(struct parser *p)
{
	int idx;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	idx = parser_getuint(p, "idx");
	if (idx >= MAX_COLORS) {
		/*
		 * Silently ignore indices that would have been in bounds for
		 * Angband 4.2.4 or earlier (color table was 256 then) for
		 * backwards compatibility with existing preference files.
		 * Flag indices that would be out of bounds even with 4.2.4's
		 * bigger color table.
		 */
		return (idx < 256) ?
			PARSE_ERROR_NONE : PARSE_ERROR_OUT_OF_BOUNDS;
	}

	angband_color_table[idx][0] = parser_getint(p, "k");
	angband_color_table[idx][1] = parser_getint(p, "r");
	angband_color_table[idx][2] = parser_getint(p, "g");
	angband_color_table[idx][3] = parser_getint(p, "b");

	return PARSE_ERROR_NONE;
}